

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

size_t __thiscall
PClassActor::PointerSubstitution(PClassActor *this,DObject *oldclass,DObject *newclass)

{
  PClassPlayerPawn **ppPVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = DObject::PointerSubstitution((DObject *)this,oldclass,newclass);
  uVar3 = (ulong)(this->VisibleToPlayerClass).Count;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      ppPVar1 = (this->VisibleToPlayerClass).Array;
      if (ppPVar1[uVar4] == (PClassPlayerPawn *)oldclass) {
        ppPVar1[uVar4] = (PClassPlayerPawn *)newclass;
        sVar2 = sVar2 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return sVar2;
}

Assistant:

size_t PClassActor::PointerSubstitution(DObject *oldclass, DObject *newclass)
{
	auto changed = Super::PointerSubstitution(oldclass, newclass);
	for (unsigned i = 0; i < VisibleToPlayerClass.Size(); i++)
	{
		if (VisibleToPlayerClass[i] == oldclass)
		{
			VisibleToPlayerClass[i] = static_cast<PClassPlayerPawn*>(newclass);
			changed++;
		}
	}
	return changed;
}